

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_skill.cpp
# Opt level: O2

FSkillInfo * __thiscall FSkillInfo::operator=(FSkillInfo *this,FSkillInfo *other)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  
  (this->Name).Index = (other->Name).Index;
  dVar1 = other->DoubleAmmoFactor;
  this->AmmoFactor = other->AmmoFactor;
  this->DoubleAmmoFactor = dVar1;
  dVar1 = other->DamageFactor;
  this->DropAmmoFactor = other->DropAmmoFactor;
  this->DamageFactor = dVar1;
  bVar2 = other->SlowMonsters;
  bVar3 = other->DisableCheats;
  bVar4 = other->AutoUseHealth;
  this->FastMonsters = other->FastMonsters;
  this->SlowMonsters = bVar2;
  this->DisableCheats = bVar3;
  this->AutoUseHealth = bVar4;
  this->EasyBossBrain = other->EasyBossBrain;
  this->EasyKey = other->EasyKey;
  iVar5 = other->RespawnLimit;
  this->RespawnCounter = other->RespawnCounter;
  this->RespawnLimit = iVar5;
  this->Aggressiveness = other->Aggressiveness;
  iVar5 = other->ACSReturn;
  this->SpawnFilter = other->SpawnFilter;
  this->ACSReturn = iVar5;
  FString::operator=(&this->MenuName,&other->MenuName);
  FString::operator=(&this->PicName,&other->PicName);
  TMap<FName,_FString,_THashTraits<FName>,_TValueTraits<FString>_>::operator=
            (&this->MenuNamesForPlayerClass,&other->MenuNamesForPlayerClass);
  this->MustConfirm = other->MustConfirm;
  FString::operator=(&this->MustConfirmText,&other->MustConfirmText);
  this->Shortcut = other->Shortcut;
  FString::operator=(&this->TextColor,&other->TextColor);
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::operator=
            (&this->Replace,&other->Replace);
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::operator=
            (&this->Replaced,&other->Replaced);
  dVar1 = other->FriendlyHealth;
  this->MonsterHealth = other->MonsterHealth;
  this->FriendlyHealth = dVar1;
  this->NoPain = other->NoPain;
  this->Infighting = other->Infighting;
  dVar1 = other->HealthFactor;
  this->ArmorFactor = other->ArmorFactor;
  this->HealthFactor = dVar1;
  return this;
}

Assistant:

FSkillInfo &FSkillInfo::operator=(const FSkillInfo &other)
{
	Name = other.Name;
	AmmoFactor = other.AmmoFactor;
	DoubleAmmoFactor = other.DoubleAmmoFactor;
	DropAmmoFactor = other.DropAmmoFactor;
	DamageFactor = other.DamageFactor;
	FastMonsters = other.FastMonsters;
	SlowMonsters = other.SlowMonsters;
	DisableCheats = other.DisableCheats;
	AutoUseHealth = other.AutoUseHealth;
	EasyBossBrain = other.EasyBossBrain;
	EasyKey = other.EasyKey;
	RespawnCounter= other.RespawnCounter;
	RespawnLimit= other.RespawnLimit;
	Aggressiveness= other.Aggressiveness;
	SpawnFilter = other.SpawnFilter;
	ACSReturn = other.ACSReturn;
	MenuName = other.MenuName;
	PicName = other.PicName;
	MenuNamesForPlayerClass = other.MenuNamesForPlayerClass;
	MustConfirm = other.MustConfirm;
	MustConfirmText = other.MustConfirmText;
	Shortcut = other.Shortcut;
	TextColor = other.TextColor;
	Replace = other.Replace;
	Replaced = other.Replaced;
	MonsterHealth = other.MonsterHealth;
	FriendlyHealth = other.FriendlyHealth;
	NoPain = other.NoPain;
	Infighting = other.Infighting;
	ArmorFactor = other.ArmorFactor;
	HealthFactor = other.HealthFactor;
	return *this;
}